

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schriter.cpp
# Opt level: O0

void __thiscall
icu_63::StringCharacterIterator::setText(StringCharacterIterator *this,UnicodeString *newText)

{
  int32_t newTextLength;
  char16_t *p;
  UnicodeString *this_00;
  ConstChar16Ptr local_20;
  UnicodeString *local_18;
  UnicodeString *newText_local;
  StringCharacterIterator *this_local;
  
  this_00 = &this->text;
  local_18 = newText;
  newText_local = (UnicodeString *)this;
  icu_63::UnicodeString::operator=(this_00,newText);
  p = icu_63::UnicodeString::getBuffer(this_00);
  ConstChar16Ptr::ConstChar16Ptr(&local_20,p);
  newTextLength = icu_63::UnicodeString::length(this_00);
  UCharCharacterIterator::setText(&this->super_UCharCharacterIterator,&local_20,newTextLength);
  ConstChar16Ptr::~ConstChar16Ptr(&local_20);
  return;
}

Assistant:

void
StringCharacterIterator::setText(const UnicodeString& newText) {
    text = newText;
    UCharCharacterIterator::setText(text.getBuffer(), text.length());
}